

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_ModifyIf_Test::~ParallelFlatHashSet_ModifyIf_Test
          (ParallelFlatHashSet_ModifyIf_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, ModifyIf) {
    // --------------
    // test modify_if
    // --------------
    using Set = phmap::THIS_HASH_SET<Entry>;
    Set m = { {1, 7}, {2, 9} };

    auto set_value = [](Set::value_type& v) { v.value = 11; };
    EXPECT_TRUE(m.modify_if(Entry{2}, set_value));

    auto val = 0; 
    auto get_value = [&val](const Set::value_type& v) { val = v.value; };
    EXPECT_TRUE(m.if_contains(Entry{2}, get_value));
    EXPECT_EQ(val, 11);

    EXPECT_FALSE(m.modify_if(Entry{3}, set_value)); // because m[3] does not exist
}